

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapHills(Layer *l,int *out,int x,int z,int w,int h)

{
  char cVar1;
  int id1;
  uint64_t uVar2;
  uint64_t ss;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint64_t uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int *local_b8;
  int *local_88;
  int *local_80;
  long local_78;
  
  if (l->p2 == (Layer *)0x0) {
    puts("mapHills() requires two parents! Use setupMultiLayer()");
    exit(1);
  }
  iVar18 = w + 2;
  iVar14 = h + 2;
  iVar4 = (*l->p->getMap)(l->p,out,x + -1,z + -1,iVar18,iVar14);
  if (iVar4 == 0) {
    lVar19 = (long)iVar18;
    iVar4 = (*l->p2->getMap)(l->p2,out + iVar14 * lVar19,x + -1,z + -1,iVar18,iVar14);
    if (iVar4 == 0) {
      cVar1 = l->mc;
      iVar18 = (int)cVar1;
      uVar2 = l->startSalt;
      lVar17 = (long)w;
      iVar4 = 3;
      if (9 < iVar18) {
        iVar4 = 0x22;
      }
      iVar5 = 0x18;
      if (iVar18 < 10) {
        iVar5 = 0;
      }
      lVar9 = 0;
      if (0 < lVar17) {
        lVar9 = lVar17;
      }
      ss = l->startSeed;
      uVar11 = (ulong)(uint)h;
      if (h < 1) {
        uVar11 = 0;
      }
      local_b8 = out + lVar19 + 2;
      local_80 = out + lVar19 * 2 + 1;
      local_78 = (long)out + ((long)iVar14 * 4 + 4) * lVar19 + 4;
      uVar20 = 0;
      local_88 = out;
      while (uVar20 != uVar11) {
        for (lVar16 = 0; lVar9 != lVar16; lVar16 = lVar16 + 1) {
          iVar14 = local_b8[lVar16 + -1];
          iVar13 = 1;
          if (((cVar1 < '\n') ||
              (iVar6 = *(int *)(local_78 + lVar16 * 4), iVar13 = (iVar6 + -2) % 0x1d,
              iVar6 < 2 || iVar13 != 1)) || (iVar6 = isShallowOcean(iVar14), iVar13 = 1, iVar6 != 0)
             ) {
            uVar10 = getChunkSeed(ss,x + (int)lVar16,(int)uVar20 + z);
            if ((iVar13 != 0) && (((long)uVar10 >> 0x18) % 3 != 0)) {
              out[lVar16] = iVar14;
              goto LAB_00117e16;
            }
            iVar6 = 0x11;
            switch(iVar14) {
            case 0:
              iVar6 = iVar5;
              break;
            case 1:
              iVar6 = 4;
              if (('\t' < cVar1) &&
                 (lVar12 = (uVar10 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar10 + uVar2,
                 auVar3._8_8_ = lVar12 >> 0x3f, auVar3._0_8_ = lVar12 >> 0x18, iVar6 = 0x12,
                 SUB168(auVar3 % SEXT816(3),0) != 0)) {
                iVar6 = 4;
              }
              break;
            case 2:
              break;
            case 3:
              iVar6 = iVar4;
              break;
            case 4:
              iVar6 = 0x12;
              break;
            case 5:
              iVar6 = 0x13;
              break;
            case 6:
            case 7:
            case 8:
            case 9:
            case 10:
            case 0xb:
switchD_00117bf3_caseD_6:
              iVar8 = areSimilar(iVar18,iVar14,0x26);
              iVar6 = 0x25;
              if (iVar8 != 0) break;
              iVar6 = isDeepOcean(iVar14);
              if ((iVar6 != 0) &&
                 (lVar12 = (uVar10 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar10 + uVar2,
                 (lVar12 >> 0x18) % 3 == 0)) {
                iVar6 = (int)lVar12;
                iVar6 = ((uint)((iVar6 * 0x957f2d + 0x167814f) * iVar6 + (int)uVar2) >> 0x18 & 1) *
                        3 + 1;
                break;
              }
              goto LAB_00117e03;
            case 0xc:
              iVar6 = 0xd;
              break;
            default:
              switch(iVar14) {
              case 0x15:
                iVar6 = 0x16;
                break;
              case 0x16:
              case 0x17:
              case 0x18:
              case 0x19:
              case 0x1a:
              case 0x1c:
              case 0x1f:
              case 0x21:
              case 0x22:
                goto switchD_00117bf3_caseD_6;
              case 0x1b:
                iVar6 = 0x1c;
                break;
              case 0x1d:
                iVar6 = 1;
                break;
              case 0x1e:
                iVar6 = 0x1f;
                break;
              case 0x20:
                iVar6 = 0x21;
                break;
              case 0x23:
                iVar6 = 0x24;
                break;
              default:
                if (iVar14 != 0xa8) goto switchD_00117bf3_caseD_6;
                iVar6 = 0xa9;
              }
            }
            if (((iVar13 == 0) && (iVar6 != iVar14)) &&
               (iVar13 = getMutated(iVar18,iVar6), iVar6 = iVar14, -1 < iVar13)) {
              iVar6 = iVar13;
            }
            if (iVar6 != iVar14) {
              iVar13 = local_b8[lVar16 + -2];
              iVar8 = local_b8[lVar16];
              id1 = local_80[lVar16];
              iVar7 = areSimilar(iVar18,local_88[lVar16 + 1],iVar14);
              uVar15 = (uint)(iVar7 != 0);
              iVar8 = areSimilar(iVar18,iVar8,iVar14);
              if (iVar8 != 0) {
                uVar15 = uVar15 + 1;
              }
              iVar13 = areSimilar(iVar18,iVar13,iVar14);
              iVar8 = areSimilar(iVar18,id1,iVar14);
              if ((iVar18 < 10) + 3 <= ((uVar15 - (iVar13 == 0)) + 2) - (uint)(iVar8 == 0)) {
                out[lVar16] = iVar6;
                goto LAB_00117e16;
              }
            }
LAB_00117e03:
            out[lVar16] = iVar14;
          }
          else {
            iVar13 = getMutated(iVar18,iVar14);
            if (iVar13 < 1) {
              out[lVar16] = iVar14;
            }
            else {
              out[lVar16] = iVar13;
            }
          }
LAB_00117e16:
        }
        local_b8 = local_b8 + lVar19;
        local_80 = local_80 + lVar19;
        local_88 = local_88 + lVar19;
        local_78 = local_78 + lVar19 * 4;
        out = out + lVar17;
        uVar20 = uVar20 + 1;
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int mapHills(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    if unlikely(l->p2 == NULL)
    {
        printf("mapHills() requires two parents! Use setupMultiLayer()\n");
        exit(1);
    }